

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.C
# Opt level: O1

CmdLineArg * __thiscall
CmdLine::next(CmdLineArg *__return_storage_ptr__,CmdLine *this,int argc,char **argv)

{
  char cVar1;
  int iVar2;
  char *__s;
  int iVar3;
  size_t __n;
  char *pcVar4;
  CmdLineOption *pCVar5;
  char cVar6;
  bool bVar7;
  char *local_68;
  
  iVar2 = this->_idx;
  this->_idx = iVar2 + 1;
  if (argc <= iVar2 + 1) {
    __return_storage_ptr__->_what = '\0';
    __return_storage_ptr__->_name = (char *)0x0;
    __return_storage_ptr__->_opt = (char *)0x0;
    return __return_storage_ptr__;
  }
  pcVar4 = argv[(long)iVar2 + 1];
  if (*pcVar4 == '-') {
    cVar1 = pcVar4[1];
    if (cVar1 != '\0') {
      if (cVar1 == '-') {
        if (pcVar4[2] == '\0') goto LAB_00107289;
        local_68 = pcVar4 + 2;
      }
      else {
        local_68 = pcVar4 + 1;
      }
      pCVar5 = this->_opts;
      cVar6 = pCVar5->shortName;
      bVar7 = cVar6 == '\0';
      if (bVar7) {
        local_68 = (char *)0x0;
      }
      else {
        do {
          if (cVar1 == '-') {
            __s = pCVar5->longName;
            if (__s != (char *)0x0) {
              __n = strlen(__s);
              iVar3 = strncmp(local_68,__s,__n);
              if ((iVar3 == 0) && ((local_68[__n] == '\0' || (local_68[__n] == '=')))) {
                local_68 = local_68 + __n;
                goto LAB_00107250;
              }
            }
          }
          else if (*local_68 == cVar6) {
            local_68 = local_68 + 1;
            goto LAB_00107250;
          }
          cVar6 = pCVar5[1].shortName;
          pCVar5 = pCVar5 + 1;
          bVar7 = cVar6 == '\0';
        } while (!bVar7);
        local_68 = (char *)0x0;
      }
LAB_00107250:
      if ((!bVar7) && (local_68 != (char *)0x0)) {
        if (pCVar5->flag == RequiredArgument) {
          if (*local_68 == '\0') {
            this->_idx = iVar2 + 2;
            if (iVar2 + 2 < argc) {
              pcVar4 = pCVar5->longName;
              local_68 = argv[(long)iVar2 + 2];
              goto LAB_001072da;
            }
            __return_storage_ptr__->_what = '\x03';
            goto LAB_0010728c;
          }
          if (*local_68 == '=') {
            local_68 = local_68 + 1;
            pcVar4 = pCVar5->longName;
LAB_001072da:
            __return_storage_ptr__->_what = cVar6;
            __return_storage_ptr__->_name = pcVar4;
            __return_storage_ptr__->_opt = local_68;
            return __return_storage_ptr__;
          }
        }
        if (*local_68 == '\0') {
          pcVar4 = pCVar5->longName;
          __return_storage_ptr__->_what = cVar6;
          __return_storage_ptr__->_name = pcVar4;
          goto LAB_00107290;
        }
      }
    }
LAB_00107289:
    __return_storage_ptr__->_what = '\x02';
  }
  else {
    __return_storage_ptr__->_what = '\x01';
  }
LAB_0010728c:
  __return_storage_ptr__->_name = pcVar4;
LAB_00107290:
  __return_storage_ptr__->_opt = (char *)0x0;
  return __return_storage_ptr__;
}

Assistant:

CmdLineArg const CmdLine::next(int argc, char * argv[])
{
    ++_idx;
    if (_idx >= argc) {
        return CmdLineArg();
    }

    char const * arg = argv[_idx];

    // Is it a command line argument?
    if (*arg != '-') {
        return CmdLineArg(CmdLineArg::NO_OPTION, argv[_idx]);
    }

    // Otherwise it is a short or long command line option
    bool longOpt = false;
    if (*arg == '-') {
        ++arg;
        if (*arg == '\0') {
            return CmdLineArg(CmdLineArg::INVALID_OPTION, argv[_idx]);
        }
    }
    if (*arg == '-') {
        ++arg;
        if (*arg == '\0') {
            return CmdLineArg(CmdLineArg::INVALID_OPTION, argv[_idx]);
        }
        longOpt = true;
    }

    // The rest shall be the command line option
    CmdLineOption const * opt = _opts;
    char const * end = nullptr;
    for (; opt->shortName != '\0'; ++opt) {
        if (longOpt) {
            if (opt->longName != nullptr && strncmp(arg, opt->longName, strlen(opt->longName)) == 0) {
                end = arg + strlen(opt->longName);
                // Shall end with '\0' or '='
                if (*end == '\0' || *end == '=') {
                    break;
                }
                // Otherwise keep looking for matches
                end = nullptr;
            }
        }
        else {
            if (*arg == opt->shortName) {
                end = arg + 1;
                break;
            }
        }
    }

    // Is it an invalid option
    if (opt->shortName == '\0' || end == nullptr) {
        return CmdLineArg(CmdLineArg::INVALID_OPTION, argv[_idx]);
    }

    // Does it require arguments?
    if (opt->flag == CmdLineOption::RequiredArgument) {
        // Shall end with '=' or '\0'
        if (*end == '=') {
            ++end;
            return CmdLineArg(opt->shortName, opt->longName, end);
        }
        else if (*end == '\0') {
            // Argument is next
            ++_idx;
            if (_idx >= argc) {
                return CmdLineArg(CmdLineArg::REQUIRES_ARGUMENT, argv[_idx - 1]);
            }
            return CmdLineArg(opt->shortName, opt->longName, argv[_idx]);
        }
    }

    // Does not require arguments; end shall be '\0'
    if (*end == '\0') {
        return CmdLineArg(opt->shortName, opt->longName);
    }

    // Otherwise this is an invalid option
    return CmdLineArg(CmdLineArg::INVALID_OPTION, argv[_idx]);
}